

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UBool icu_63::ICU_Utility::escapeUnprintable(UnicodeString *result,UChar32 c)

{
  UBool UVar1;
  UChar32 c_local;
  UnicodeString *result_local;
  
  UVar1 = isUnprintable(c);
  if (UVar1 == '\0') {
    result_local._7_1_ = '\0';
  }
  else {
    UnicodeString::append(result,L'\\');
    if ((c & 0xffff0000U) == 0) {
      UnicodeString::append(result,L'u');
    }
    else {
      UnicodeString::append(result,L'U');
      UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 0x1c & 0xf)]);
      UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 0x18 & 0xf)]);
      UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 0x14 & 0xf)]);
      UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 0x10 & 0xf)]);
    }
    UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 0xc & 0xf)]);
    UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 8 & 0xf)]);
    UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c >> 4 & 0xf)]);
    UnicodeString::append(result,L"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(c & 0xf)]);
    result_local._7_1_ = '\x01';
  }
  return result_local._7_1_;
}

Assistant:

UBool ICU_Utility::escapeUnprintable(UnicodeString& result, UChar32 c) {
    if (isUnprintable(c)) {
        result.append(BACKSLASH);
        if (c & ~0xFFFF) {
            result.append(UPPER_U);
            result.append(DIGITS[0xF&(c>>28)]);
            result.append(DIGITS[0xF&(c>>24)]);
            result.append(DIGITS[0xF&(c>>20)]);
            result.append(DIGITS[0xF&(c>>16)]);
        } else {
            result.append(LOWER_U);
        }
        result.append(DIGITS[0xF&(c>>12)]);
        result.append(DIGITS[0xF&(c>>8)]);
        result.append(DIGITS[0xF&(c>>4)]);
        result.append(DIGITS[0xF&c]);
        return TRUE;
    }
    return FALSE;
}